

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::ListBoxFooter(void)

{
  ImVec2 IVar1;
  ImVec2 IVar2;
  ImGuiWindow *pIVar3;
  ImGuiContext *pIVar4;
  ImGuiContext *pIVar5;
  ImGuiWindow *pIVar6;
  float local_38;
  float fStack_34;
  float local_28;
  float fStack_24;
  ImVec2 local_18;
  
  pIVar6 = GetParentWindow();
  pIVar4 = GImGui;
  IVar1 = (pIVar6->DC).LastItemRect.Min;
  IVar2 = (pIVar6->DC).LastItemRect.Max;
  EndChild();
  PopStyleVar(2);
  PopStyleColor(1);
  pIVar5 = GImGui;
  pIVar3 = GImGui->CurrentWindow;
  pIVar3->Accessed = true;
  if (pIVar3->SkipItems == false) {
    (pIVar3->DC).CursorPos.x = (pIVar5->Style).ItemSpacing.x + (pIVar3->DC).CursorPosPrevLine.x;
    (pIVar3->DC).CursorPos.y = (pIVar3->DC).CursorPosPrevLine.y;
    (pIVar3->DC).CurrentLineHeight = (pIVar3->DC).PrevLineHeight;
    (pIVar3->DC).CurrentLineTextBaseOffset = (pIVar3->DC).PrevLineTextBaseOffset;
  }
  local_38 = IVar1.x;
  fStack_34 = IVar1.y;
  (pIVar6->DC).CursorPos.x = local_38;
  (pIVar6->DC).CursorPos.y = fStack_34;
  local_28 = IVar2.x;
  fStack_24 = IVar2.y;
  local_18.y = fStack_24 - fStack_34;
  local_18.x = local_28 - local_38;
  ItemSize(&local_18,(pIVar4->Style).FramePadding.y);
  EndGroup();
  return;
}

Assistant:

void ImGui::ListBoxFooter()
{
    ImGuiWindow* parent_window = GetParentWindow();
    const ImRect bb = parent_window->DC.LastItemRect;
    const ImGuiStyle& style = GetStyle();

    EndChildFrame();

    // Redeclare item size so that it includes the label (we have stored the full size in LastItemRect)
    // We call SameLine() to restore DC.CurrentLine* data
    SameLine();
    parent_window->DC.CursorPos = bb.Min;
    ItemSize(bb, style.FramePadding.y);
    EndGroup();
}